

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strrchr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  int nLen;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if ((1 < nArg) && (pcVar3 = jx9_value_to_string(*apArg,&local_24), 0 < local_24)) {
    pjVar1 = apArg[1];
    if ((pjVar1->iFlags & 1) == 0) {
      jx9MemObjToInteger(pjVar1);
      iVar2 = *(int *)&pjVar1->x;
    }
    else {
      pcVar4 = jx9_value_to_string(pjVar1,(int *)0x0);
      iVar2 = (int)*pcVar4;
    }
    pcVar4 = pcVar3 + ((ulong)(local_24 - 1) - 1);
    do {
      if (iVar2 == pcVar4[1]) {
        pcVar5 = pcVar4 + 1;
LAB_0013130d:
        jx9_value_string(pCtx->pRet,pcVar3 + ((long)pcVar5 - (long)pcVar3 & 0xffffffff),
                         local_24 - (int)((long)pcVar5 - (long)pcVar3));
        return 0;
      }
      if (pcVar4 < pcVar3) break;
      pcVar5 = pcVar4;
      if (iVar2 == *pcVar4) goto LAB_0013130d;
      pcVar5 = pcVar4 + -1;
      if (pcVar5 < pcVar3) break;
      if (iVar2 == *pcVar5) goto LAB_0013130d;
      pcVar5 = pcVar4 + -2;
      if (pcVar5 < pcVar3) break;
      if (iVar2 == *pcVar5) goto LAB_0013130d;
      pcVar5 = pcVar4 + -3;
      pcVar4 = pcVar4 + -4;
    } while (pcVar3 <= pcVar5);
  }
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  (pjVar1->x).rVal = 0.0;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strrchr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zBlob;
	int nLen, c;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	c = 0; /* cc warning */
	if( nLen > 0 ){
		sxu32 nOfft;
		sxi32 rc;
		if( jx9_value_is_string(apArg[1]) ){
			const char *zPattern;
			zPattern = jx9_value_to_string(apArg[1], 0); /* Never fail, so there is no need to check
														 * for NULL pointer.
														 */
			c = zPattern[0];
		}else{
			/* Int cast */
			c = jx9_value_to_int(apArg[1]);
		}
		/* Perform the lookup */
		rc = SyByteFind2(zBlob, (sxu32)nLen, c, &nOfft);
		if( rc != SXRET_OK ){
			/* No such entry, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the string portion */
		jx9_result_string(pCtx, &zBlob[nOfft], (int)(&zBlob[nLen]-&zBlob[nOfft]));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}